

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

APInt __thiscall llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt(IEEEFloat *this)

{
  opStatus oVar1;
  IEEEFloat *pIVar2;
  undefined8 extraout_RDX;
  IEEEFloat *in_RSI;
  APInt AVar3;
  ArrayRef<unsigned_long> bigVal;
  bool losesInfo;
  uint64_t words [2];
  IEEEFloat u;
  IEEEFloat v;
  IEEEFloat extended;
  fltSemantics extendedSemantics;
  IEEEFloat *local_28;
  Significand local_20;
  
  if (in_RSI->semantics != (fltSemantics *)semPPCDoubleDoubleLegacy) {
    __assert_fail("semantics == (const llvm::fltSemantics *)&semPPCDoubleDoubleLegacy",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb0e,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  extendedSemantics.sizeInBits = 0x80;
  extendedSemantics.maxExponent = 0x3ff;
  extendedSemantics.minExponent = -0x3fe;
  extendedSemantics.precision = 0x6a;
  IEEEFloat(&extended,in_RSI);
  oVar1 = convert(&extended,&extendedSemantics,rmNearestTiesToEven,&losesInfo);
  if ((oVar1 != opOK) || ((losesInfo & 1U) != 0)) {
    __assert_fail("fs == opOK && !losesInfo",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb1f,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  IEEEFloat(&u,&extended);
  oVar1 = convert(&u,(fltSemantics *)semIEEEdouble,rmNearestTiesToEven,&losesInfo);
  if ((oVar1 & (opUnderflow|opOverflow|opDivByZero|opInvalidOp)) != opOK) {
    __assert_fail("fs == opOK || fs == opInexact",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb24,
                  "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
  }
  convertDoubleAPFloatToAPInt(&v);
  pIVar2 = &v;
  if (0x40 < (uint)v.significand.part._0_4_) {
    pIVar2 = (IEEEFloat *)v.semantics;
  }
  words[0] = (uint64_t)pIVar2->semantics;
  APInt::~APInt((APInt *)&v);
  if (((u._18_1_ & 7) == 3 || (u._18_1_ & 6) == 0) || (losesInfo != true)) {
    words[1] = 0;
  }
  else {
    oVar1 = convert(&u,&extendedSemantics,rmNearestTiesToEven,&losesInfo);
    if ((oVar1 != opOK) || ((losesInfo & 1U) != 0)) {
      __assert_fail("fs == opOK && !losesInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xb2e,
                    "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
    }
    IEEEFloat(&v,&extended);
    subtract(&v,&u,rmNearestTiesToEven);
    oVar1 = convert(&v,(fltSemantics *)semIEEEdouble,rmNearestTiesToEven,&losesInfo);
    if ((oVar1 != opOK) || ((losesInfo & 1U) != 0)) {
      __assert_fail("fs == opOK && !losesInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xb34,
                    "APInt llvm::detail::IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const");
    }
    convertDoubleAPFloatToAPInt((IEEEFloat *)&local_28);
    pIVar2 = (IEEEFloat *)&local_28;
    if (0x40 < (uint)local_20.part._0_4_) {
      pIVar2 = local_28;
    }
    words[1] = (uint64_t)pIVar2->semantics;
    APInt::~APInt((APInt *)&local_28);
    ~IEEEFloat(&v);
  }
  bigVal.Length = 2;
  bigVal.Data = words;
  APInt::APInt((APInt *)this,0x80,bigVal);
  ~IEEEFloat(&u);
  ~IEEEFloat(&extended);
  AVar3._8_8_ = extraout_RDX;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt IEEEFloat::convertPPCDoubleDoubleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics *)&semPPCDoubleDoubleLegacy);
  assert(partCount()==2);

  uint64_t words[2];
  opStatus fs;
  bool losesInfo;

  // Convert number to double.  To avoid spurious underflows, we re-
  // normalize against the "double" minExponent first, and only *then*
  // truncate the mantissa.  The result of that second conversion
  // may be inexact, but should never underflow.
  // Declare fltSemantics before APFloat that uses it (and
  // saves pointer to it) to ensure correct destruction order.
  fltSemantics extendedSemantics = *semantics;
  extendedSemantics.minExponent = semIEEEdouble.minExponent;
  IEEEFloat extended(*this);
  fs = extended.convert(extendedSemantics, rmNearestTiesToEven, &losesInfo);
  assert(fs == opOK && !losesInfo);
  (void)fs;

  IEEEFloat u(extended);
  fs = u.convert(semIEEEdouble, rmNearestTiesToEven, &losesInfo);
  assert(fs == opOK || fs == opInexact);
  (void)fs;
  words[0] = *u.convertDoubleAPFloatToAPInt().getRawData();

  // If conversion was exact or resulted in a special case, we're done;
  // just set the second double to zero.  Otherwise, re-convert back to
  // the extended format and compute the difference.  This now should
  // convert exactly to double.
  if (u.isFiniteNonZero() && losesInfo) {
    fs = u.convert(extendedSemantics, rmNearestTiesToEven, &losesInfo);
    assert(fs == opOK && !losesInfo);
    (void)fs;

    IEEEFloat v(extended);
    v.subtract(u, rmNearestTiesToEven);
    fs = v.convert(semIEEEdouble, rmNearestTiesToEven, &losesInfo);
    assert(fs == opOK && !losesInfo);
    (void)fs;
    words[1] = *v.convertDoubleAPFloatToAPInt().getRawData();
  } else {
    words[1] = 0;
  }

  return APInt(128, words);
}